

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O2

Entity * Entity::from_json(Json *json,Map *map,World *world)

{
  bool bVar1;
  uchar entity_id;
  Position PVar2;
  const_reference pvVar3;
  EntityType *pEVar4;
  reference json_00;
  Entity *this;
  allocator<char> local_2f0;
  allocator<char> local_2ef;
  allocator<char> local_2ee;
  allocator<char> local_2ed;
  uchar local_2ec;
  allocator<char> local_2eb;
  allocator<char> local_2ea;
  allocator<char> local_2e9;
  allocator<char> local_2e8;
  allocator<char> local_2e7;
  allocator<char> local_2e6;
  allocator<char> local_2e5;
  allocator<char> local_2e4;
  allocator<char> local_2e3;
  allocator<char> local_2e2;
  allocator<char> local_2e1;
  const_iterator __begin2;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2c0;
  const_iterator __end2;
  Attributes local_290;
  key_type local_240;
  key_type local_220;
  key_type local_200;
  key_type local_1e0;
  key_type local_1c0;
  key_type local_1a0;
  key_type local_180;
  key_type local_160;
  key_type local_140;
  key_type local_120;
  key_type local_100;
  key_type local_e0;
  key_type local_c0;
  key_type local_a0;
  Attributes local_80;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&__end2,"entityType",&local_2e1);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)&__end2);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&__begin2,pvVar3);
  pEVar4 = World::entity_type(world,(string *)&__begin2);
  local_290.type_id = pEVar4->_id;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json<const_char_(&)[9],_char[9],_0>(&local_2c0,(char (*) [9])"position");
  PVar2 = Position::from_json(&local_2c0);
  local_290.position._0_4_ = PVar2._0_4_;
  local_290.position._4_2_ = PVar2._4_2_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"orientation",&local_2e2);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_240);
  local_290.orientation =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::get_impl<unsigned_char,_0>(pvVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"palette",&local_2e3);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_a0);
  local_290.palette =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::get_impl<unsigned_char,_0>(pvVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"speed",&local_2e4);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_c0);
  local_290.speed =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::get_impl<unsigned_char,_0>(pvVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"fightable",&local_2e5);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_e0);
  local_290.fightable =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::get_impl<bool,_0>(pvVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"liftable",&local_2e6);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_100);
  local_290.liftable =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::get_impl<bool,_0>(pvVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"canPassThrough",&local_2e7);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_120);
  local_290.can_pass_through =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::get_impl<bool,_0>(pvVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"appearAfterPlayerMovedAway",&local_2e8);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_140);
  local_290.appear_after_player_moved_away =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::get_impl<bool,_0>(pvVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"gravityImmune",&local_2e9);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_160);
  local_290.gravity_immune =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::get_impl<bool,_0>(pvVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"talkable",&local_2ea);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_180);
  local_290.talkable =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::get_impl<bool,_0>(pvVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"dialogue",&local_2eb);
  local_2ec = '\0';
  local_290.dialogue =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::value<unsigned_char,_0>(json,&local_1a0,&local_2ec);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"behaviorId",&local_2ed);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_1c0);
  local_290.behavior_id =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::get_impl<unsigned_short,_0>(pvVar3);
  local_290.entity_to_use_tiles_from = (Entity *)0x0;
  local_290.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_290.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_290.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_290.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_290.persistence_flag.byte = 0xff;
  local_290.persistence_flag.bit = 0xff;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"flagUnknown_2_3",&local_2ee);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_1e0);
  local_290.flag_unknown_2_3 =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::get_impl<bool,_0>(pvVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"flagUnknown_2_4",&local_2ef);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_200);
  local_290.flag_unknown_2_4 =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::get_impl<bool,_0>(pvVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"flagUnknown_3_5",&local_2f0);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_220);
  local_290.flag_unknown_3_5 =
       nlohmann::
       basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       ::get_impl<bool,_0>(pvVar3);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_240);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_2c0);
  std::__cxx11::string::~string((string *)&__begin2);
  std::__cxx11::string::~string((string *)&__end2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__begin2,"useTilesFromOtherEntity",(allocator<char> *)&__end2);
  pvVar3 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,(key_type *)&__begin2);
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<bool,_0>(pvVar3);
  std::__cxx11::string::~string((string *)&__begin2);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin2,"entityIdToUseTilesFrom",(allocator<char> *)&__end2);
    pvVar3 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)&__begin2);
    entity_id = nlohmann::
                basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<unsigned_char,_0>(pvVar3);
    std::__cxx11::string::~string((string *)&__begin2);
    local_290.entity_to_use_tiles_from = Map::entity(map,entity_id);
  }
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[10],_0>(json,(char (*) [10])"maskFlags");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin2,"maskFlags",(allocator<char> *)&__end2);
    pvVar3 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,(key_type *)&__begin2);
    std::__cxx11::string::~string((string *)&__begin2);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cbegin(&__begin2,pvVar3);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend(&__end2,pvVar3);
    while( true ) {
      bVar1 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator!=<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        (&__begin2,&__end2);
      if (!bVar1) break;
      json_00 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*(&__begin2);
      EntityMaskFlag::from_json((EntityMaskFlag *)&local_240,json_00);
      std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
                (&local_290.mask_flags,(EntityMaskFlag *)&local_240);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++(&__begin2);
    }
  }
  this = (Entity *)operator_new(0x58);
  Attributes::Attributes(&local_80,&local_290);
  Entity(this,&local_80);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_80.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  this->_map = map;
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_290.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  return this;
}

Assistant:

Entity* Entity::from_json(const Json& json, Map* map, const World& world)
{
    Attributes attrs {
        .type_id = world.entity_type((std::string)json.at("entityType"))->id(),

        .position = Position::from_json("position"),
        .orientation = json.at("orientation"),
        .palette = json.at("palette"),
        .speed = json.at("speed"),

        .fightable = json.at("fightable"),
        .liftable = json.at("liftable"),
        .can_pass_through = json.at("canPassThrough"),
        .appear_after_player_moved_away = json.at("appearAfterPlayerMovedAway"),
        .gravity_immune = json.at("gravityImmune"),

        .talkable = json.at("talkable"),
        .dialogue = json.value<uint8_t>("dialogue", 0),

        .behavior_id = json.at("behaviorId"),

        .flag_unknown_2_3 = json.at("flagUnknown_2_3"),
        .flag_unknown_2_4 = json.at("flagUnknown_2_4"),
        .flag_unknown_3_5 = json.at("flagUnknown_3_5"),
    };

    bool use_tiles_from_other_entity = json.at("useTilesFromOtherEntity");
    if(use_tiles_from_other_entity)
    {
        uint8_t entity_id_to_use_tiles_from = json.at("entityIdToUseTilesFrom");
        attrs.entity_to_use_tiles_from = map->entity(entity_id_to_use_tiles_from);
    }

    if(json.contains("maskFlags"))
    {
        for(const Json& j : json.at("maskFlags"))
            attrs.mask_flags.emplace_back(EntityMaskFlag::from_json(j));
    }

    Entity* entity = new Entity(attrs);
    entity->_map = map;

    return entity;
}